

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_string.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CMStringDecompressDeserialize
          (duckdb *this,Deserializer *deserializer,ScalarFunction *function)

{
  reference input_type;
  LogicalType *pLVar1;
  _Any_data local_68;
  pointer local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_48,deserializer,100,"arguments");
  local_68._M_unused._M_object =
       (function->super_BaseScalarFunction).super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68._8_8_ =
       *(pointer *)
        ((long)&(function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data + 8);
  local_58 = *(pointer *)
              ((long)&(function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data + 0x10);
  (function->super_BaseScalarFunction).super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(function->super_BaseScalarFunction).super_SimpleFunction.arguments.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data + 8) =
       local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(function->super_BaseScalarFunction).super_SimpleFunction.arguments.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  input_type = vector<duckdb::LogicalType,_true>::operator[]
                         (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  GetStringDecompressFunctionSwitch((scalar_function_t *)&local_68,input_type);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  operator=(&function->function,
            (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            &local_68);
  if (local_58 != (pointer)0x0) {
    (*(code *)local_58)(&local_68,&local_68,3);
  }
  pLVar1 = Deserializer::Get<duckdb::LogicalType_const&>(deserializer);
  if (&(function->super_BaseScalarFunction).return_type != pLVar1) {
    (function->super_BaseScalarFunction).return_type.id_ = pLVar1->id_;
    (function->super_BaseScalarFunction).return_type.physical_type_ = pLVar1->physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(function->super_BaseScalarFunction).return_type.type_info_,&pLVar1->type_info_);
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> CMStringDecompressDeserialize(Deserializer &deserializer, ScalarFunction &function) {
	function.arguments = deserializer.ReadProperty<vector<LogicalType>>(100, "arguments");
	function.function = GetStringDecompressFunctionSwitch(function.arguments[0]);
	function.return_type = deserializer.Get<const LogicalType &>();
	return nullptr;
}